

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
NinePatchMargin::writeXml_abi_cxx11_
          (string *__return_storage_ptr__,NinePatchMargin *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  int level;
  int level_00;
  stringstream str;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(&local_250,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a0,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"<NinePatchMargin>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_1d0,"Top",(allocator *)&local_250);
  indent_00 = indent + 1;
  Util::writeXmlElement<int>((stringstream *)local_1b0,indent_00,&local_1d0,this->top);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1f0,"Left",(allocator *)&local_250);
  Util::writeXmlElement<int>((stringstream *)local_1b0,indent_00,&local_1f0,this->left);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_210,"Right",(allocator *)&local_250);
  Util::writeXmlElement<int>((stringstream *)local_1b0,indent_00,&local_210,this->right);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"Bottom",(allocator *)&local_250);
  Util::writeXmlElement<int>((stringstream *)local_1b0,indent_00,&local_230,this->bottom);
  std::__cxx11::string::~string((string *)&local_230);
  Util::getIndent_abi_cxx11_(&local_250,(Util *)(ulong)(uint)indent,level_00);
  poVar1 = std::operator<<(local_1a0,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"</NinePatchMargin>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string NinePatchMargin::writeXml(int indent) const
{
	std::stringstream str;
	
	str << Util::getIndent(indent) << "<NinePatchMargin>" << std::endl;
	Util::writeXmlElement(str, indent + 1, "Top", top);
	Util::writeXmlElement(str, indent + 1, "Left", left);
	Util::writeXmlElement(str, indent + 1, "Right", right);
	Util::writeXmlElement(str, indent + 1, "Bottom", bottom);
	str << Util::getIndent(indent) << "</NinePatchMargin>" << std::endl;

	return str.str();
}